

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostic.cpp
# Opt level: O1

spv_result_t spvDiagnosticPrint(spv_diagnostic diagnostic)

{
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  ostream *poVar4;
  _Ios_Iostate _Var5;
  char *__s;
  
  if (diagnostic == (spv_diagnostic)0x0) {
    return SPV_ERROR_INVALID_DIAGNOSTIC;
  }
  bVar1 = diagnostic->isTextSource;
  poVar4 = (ostream *)&std::cerr;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: ",7);
  if (bVar1 == true) {
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    __s = diagnostic->error;
    if (__s != (char *)0x0) {
LAB_0021f4f1:
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar3);
      goto LAB_0021f527;
    }
    _Var5 = (int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18);
  }
  else {
    if ((diagnostic->position).index != 0) {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
    }
    __s = diagnostic->error;
    if (__s != (char *)0x0) goto LAB_0021f4f1;
    poVar4 = (ostream *)&std::cerr;
    _Var5 = (int)*(undefined8 *)(std::cerr + -0x18) + 0x3066e0;
  }
  std::ios::clear(_Var5);
LAB_0021f527:
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  return SPV_SUCCESS;
}

Assistant:

spv_result_t spvDiagnosticPrint(const spv_diagnostic diagnostic) {
  if (!diagnostic) return SPV_ERROR_INVALID_DIAGNOSTIC;

  if (diagnostic->isTextSource) {
    // NOTE: This is a text position
    // NOTE: add 1 to the line as editors start at line 1, we are counting new
    // line characters to start at line 0
    std::cerr << "error: " << diagnostic->position.line + 1 << ": "
              << diagnostic->position.column + 1 << ": " << diagnostic->error
              << "\n";
    return SPV_SUCCESS;
  }

  // NOTE: Assume this is a binary position
  std::cerr << "error: ";
  if (diagnostic->position.index > 0)
    std::cerr << diagnostic->position.index << ": ";
  std::cerr << diagnostic->error << "\n";
  return SPV_SUCCESS;
}